

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

Clause * __thiscall LinearGE<0,_0>::explain(LinearGE<0,_0> *this,Lit param_2,int inf_id)

{
  uint uVar1;
  uint uVar2;
  Lit LVar3;
  Lit *pLVar4;
  Lit *pLVar5;
  Clause *pCVar6;
  uint in_EDX;
  long in_RDI;
  uint i_1;
  uint i;
  IntView<0> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint local_20;
  uint local_18;
  uint local_14;
  
  uVar1 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x28));
  uVar2 = vec<IntView<1>_>::size((vec<IntView<1>_> *)(in_RDI + 0x38));
  local_14 = in_EDX;
  if (in_EDX == uVar1 + uVar2) {
    local_14 = 0xffffffff;
  }
  local_18 = 0;
  while( true ) {
    uVar1 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x28));
    if (uVar1 <= local_18) break;
    vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x28),local_18);
    LVar3 = IntView<0>::getMaxLit(in_stack_ffffffffffffffa8);
    pLVar4 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_18);
    pLVar4->x = LVar3.x;
    local_18 = local_18 + 1;
  }
  local_20 = 0;
  while( true ) {
    uVar1 = vec<IntView<1>_>::size((vec<IntView<1>_> *)(in_RDI + 0x38));
    if (uVar1 <= local_20) break;
    vec<IntView<1>_>::operator[]((vec<IntView<1>_> *)(in_RDI + 0x38),local_20);
    LVar3 = IntView<1>::getMaxLit((IntView<1> *)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb4 = local_20;
    uVar1 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x28));
    pLVar4 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),in_stack_ffffffffffffffb4 + uVar1);
    pLVar4->x = LVar3.x;
    local_20 = local_20 + 1;
  }
  pLVar4 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
  pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_14);
  pLVar5->x = pLVar4->x;
  pCVar6 = Reason_new<vec<Lit>>
                     ((vec<Lit> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return pCVar6;
}

Assistant:

Clause* explain(Lit /*p*/, int inf_id) override {
		if (inf_id == static_cast<int>(x.size() + y.size())) {
			inf_id = -1;
		}
		if ((R != 0) && r.isFixed()) {
			ps[0] = r.getValLit();
		}
		for (unsigned int i = 0; i < x.size(); i++) {
			ps[i + R] = x[i].getMaxLit();
		}
		for (unsigned int i = 0; i < y.size(); i++) {
			ps[i + R + x.size()] = y[i].getMaxLit();
		}
		ps[R + inf_id] = ps[0];
		return Reason_new(ps);
	}